

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeCommitPhaseTwo(Btree *p,int bCleanup)

{
  BtShared *pBt;
  Pager *pPager;
  int rc;
  
  if (p->inTrans == '\0') {
    return 0;
  }
  sqlite3BtreeEnter(p);
  if (p->inTrans == '\x02') {
    pBt = p->pBt;
    pPager = pBt->pPager;
    rc = pPager->errCode;
    if (rc == 0) {
      pPager->iDataVersion = pPager->iDataVersion + 1;
      if (((pPager->eState != '\x02') || (pPager->exclusiveMode == '\0')) ||
         (pPager->journalMode != '\x01')) {
        rc = pager_end_transaction(pPager,(uint)pPager->setSuper,1);
        pager_error(pPager,rc);
        goto LAB_00119789;
      }
      pPager->eState = '\x01';
    }
    else {
LAB_00119789:
      if ((bCleanup == 0) && (rc != 0)) goto LAB_001197ad;
    }
    p->iBDataVersion = p->iBDataVersion - 1;
    pBt->inTransaction = '\x01';
    btreeClearHasContent(pBt);
  }
  btreeEndTransaction(p);
  rc = 0;
LAB_001197ad:
  sqlite3BtreeLeave(p);
  return rc;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCommitPhaseTwo(Btree *p, int bCleanup){

  if( p->inTrans==TRANS_NONE ) return SQLITE_OK;
  sqlite3BtreeEnter(p);
  btreeIntegrity(p);

  /* If the handle has a write-transaction open, commit the shared-btrees
  ** transaction and set the shared state to TRANS_READ.
  */
  if( p->inTrans==TRANS_WRITE ){
    int rc;
    BtShared *pBt = p->pBt;
    assert( pBt->inTransaction==TRANS_WRITE );
    assert( pBt->nTransaction>0 );
    rc = sqlite3PagerCommitPhaseTwo(pBt->pPager);
    if( rc!=SQLITE_OK && bCleanup==0 ){
      sqlite3BtreeLeave(p);
      return rc;
    }
    p->iBDataVersion--;  /* Compensate for pPager->iDataVersion++; */
    pBt->inTransaction = TRANS_READ;
    btreeClearHasContent(pBt);
  }

  btreeEndTransaction(p);
  sqlite3BtreeLeave(p);
  return SQLITE_OK;
}